

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bac.h
# Opt level: O2

int Bac_NtkBoxNum(Bac_Ntk_t *p)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int Counter;
  int iVar4;
  int i;
  long lVar5;
  
  iVar1 = (p->vType).nSize;
  iVar4 = 0;
  iVar2 = iVar1;
  for (lVar5 = 0; lVar5 < iVar2; lVar5 = lVar5 + 1) {
    uVar3 = Abc_Lit2Var((int)(p->vType).pArray[lVar5]);
    iVar4 = iVar4 + (uint)(uVar3 < 5);
    iVar2 = (p->vType).nSize;
  }
  return iVar1 - iVar4;
}

Assistant:

static inline int            Bac_NtkBoxNum( Bac_Ntk_t * p )                  { return Bac_NtkObjNum(p) - Vec_StrCountSmallerLit(&p->vType, (char)BAC_OBJ_BOX);             }